

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O1

void __thiscall MeshLib::SolidDelegate::removeHalfedge(SolidDelegate *this,Solid *pS,HalfEdge *he)

{
  int *piVar1;
  Edge *inData;
  pointer pcVar2;
  TopologyException *this_00;
  Node<MeshLib::Edge> *pNVar3;
  
  inData = he->m_edge;
  if (inData->m_halfedge[0] == he) {
    inData->m_halfedge[0] = inData->m_halfedge[1];
  }
  else if (inData->m_halfedge[1] != he) {
    this_00 = (TopologyException *)__cxa_allocate_exception(8);
    TopologyException::TopologyException(this_00,"SolidDelegate");
    __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
  }
  inData->m_halfedge[1] = (HalfEdge *)0x0;
  if (he->m_face->m_halfedge == he) {
    he->m_face->m_halfedge = (HalfEdge *)0x0;
  }
  if (he->m_trait != (Trait *)0x0) {
    Trait::clear(&he->m_trait);
  }
  if ((inData->m_halfedge[0] == (HalfEdge *)0x0) && (inData->m_halfedge[1] == (HalfEdge *)0x0)) {
    if (inData->m_trait != (Trait *)0x0) {
      Trait::clear(&inData->m_trait);
    }
    pNVar3 = AVL::Node<MeshLib::Edge>::remove_node((pS->m_edges).root,inData);
    (pS->m_edges).root = pNVar3;
    if (pNVar3 != (Node<MeshLib::Edge> *)0x0) {
      piVar1 = &(pS->m_edges).size;
      *piVar1 = *piVar1 + -1;
    }
    pcVar2 = (inData->m_string)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(inData->m_string).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(inData);
  }
  pcVar2 = (he->m_string)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(he->m_string).field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(he);
  return;
}

Assistant:

void SolidDelegate::removeHalfedge(Solid *pS,  HalfEdge * he )
{
	//he->edge
	Edge * edge = he->edge();

	if( edge->halfedge(0) == he )
	{
		edge->halfedge(0) = edge->halfedge(1);
		edge->halfedge(1) = NULL;
	}
	else
	{
		if( edge->halfedge(1) != he ) throw TopologyException("SolidDelegate");
		edge->halfedge(1) = NULL;
	}

	
	//he->face
	if( he->face()->halfedge() == he )
	{
		he->face()->halfedge() = NULL;
	}

	if( he->trait() != NULL )
	{
		Trait::clear(  he->trait() );
	}
	//
	if( edge->halfedge(0) == NULL && edge->halfedge(1) == NULL )
	{
		if( edge->trait() != NULL )
		{
			Trait::clear( edge->trait() );
		}
		pS->m_edges.remove( edge );
		delete edge;
		edge = NULL;
	}
	delete he;
}